

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_GLMRegressor_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003cbd38 == '\x01') {
    DAT_003cbd38 = '\0';
    (*(code *)*_GLMRegressor_DoubleArray_default_instance_)();
  }
  if (DAT_003cbd88 == '\x01') {
    DAT_003cbd88 = 0;
    (*(code *)*_GLMRegressor_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _GLMRegressor_DoubleArray_default_instance_.Shutdown();
  _GLMRegressor_default_instance_.Shutdown();
}